

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<signed_char,char,short,char,int,char,long_long>
          (String *__return_storage_ptr__,kj *this,char *params,char *params_1,short *params_2,
          char *params_3,int *params_4,char *params_5,longlong *params_6)

{
  CappedArray<char,_5UL> CVar1;
  undefined5 in_stack_ffffffffffffff68;
  undefined1 uVar2;
  char cVar3;
  undefined1 uVar4;
  CappedArray<char,_8UL> local_90;
  size_t local_80;
  undefined4 local_78;
  char local_74;
  CappedArray<char,_14UL> local_70;
  CappedArray<char,_26UL> local_58;
  
  CVar1 = toCharSequence<signed_char>((char *)this);
  local_80 = CVar1.currentSize;
  local_78 = CVar1.content._0_4_;
  local_74 = CVar1.content[4];
  cVar3 = *params;
  local_90 = toCharSequence<short>((short *)params_1);
  uVar2 = (undefined1)*params_2;
  toCharSequence<int>(&local_70,(int *)params_3);
  uVar4 = (undefined1)*params_4;
  toCharSequence<long_long>(&local_58,(longlong *)params_5);
  _::
  concat<kj::CappedArray<char,5ul>,kj::FixedArray<char,1ul>,kj::CappedArray<char,8ul>,kj::FixedArray<char,1ul>,kj::CappedArray<char,14ul>,kj::FixedArray<char,1ul>,kj::CappedArray<char,26ul>>
            (__return_storage_ptr__,(_ *)&local_80,
             (CappedArray<char,_5UL> *)&stack0xffffffffffffff6e,(FixedArray<char,_1UL> *)&local_90,
             (CappedArray<char,_8UL> *)&stack0xffffffffffffff6d,(FixedArray<char,_1UL> *)&local_70,
             (CappedArray<char,_14UL> *)&stack0xffffffffffffff6f,(FixedArray<char,_1UL> *)&local_58,
             (CappedArray<char,_26UL> *)
             CONCAT17(uVar4,CONCAT16(cVar3,CONCAT15(uVar2,in_stack_ffffffffffffff68))));
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}